

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::StreamRedirect::~StreamRedirect(StreamRedirect *this)

{
  string asStack_28 [32];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)this->m_targetString);
  std::__cxx11::string::~string(asStack_28);
  std::ios::rdbuf((streambuf *)(this->m_stream + *(long *)(*(long *)this->m_stream + -0x18)));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_oss);
  return;
}

Assistant:

~StreamRedirect() {
            m_targetString += m_oss.str();
            m_stream.rdbuf( m_prevBuf );
        }